

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O0

Type * __thiscall
psy::C::TypeCanonicalizer::canonicalize(TypeCanonicalizer *this,Type *ty,Scope *scope)

{
  TypeKind TVar1;
  BasicTypeKind basicTyK;
  DeclarationCategory DVar2;
  TypeDeclarationCategory TVar3;
  TagTypeKind TVar4;
  TagTypeKind TVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Compilation *pCVar7;
  undefined4 extraout_var_02;
  const_reference ppTVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TypedefDeclarationSymbol *pTVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TagDeclarationSymbol *pTVar10;
  TypeCanonicalizer *pTVar11;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  Identifier *pIVar12;
  ostream *poVar13;
  TagType *this_00;
  Type *pTVar14;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  pair<std::__detail::_Node_iterator<const_psy::C::Type_*,_true,_false>,_bool> pVar15;
  Type *local_340;
  Type *canonTy_5;
  Type *unqualTy;
  QualifiedType *qualTy;
  SyntaxToken local_258;
  _Node_iterator_base<const_psy::C::Type_*,_false> local_220;
  undefined1 local_218;
  value_type local_210;
  TagDeclarationSymbol *local_208;
  TagDeclarationSymbol *tagDecl;
  TypeDeclarationSymbol *tyDecl_1;
  DeclarationSymbol *decl_1;
  Identifier *tag;
  TagType *tagTy;
  SyntaxToken local_1a8;
  _Node_iterator_base<const_psy::C::Type_*,_false> local_170;
  undefined1 local_168;
  value_type local_160;
  TypedefDeclarationSymbol *local_158;
  TypedefDeclarationSymbol *tydef;
  TypeDeclarationSymbol *tyDecl;
  DeclarationSymbol *decl;
  Identifier *tydefName;
  TypedefNameType *tydefNameTy;
  Type *local_120;
  Type *canonTy_4;
  Type *refedTy;
  PointerType *ptrTy;
  undefined1 local_100;
  Type *local_e8;
  Type *parmTy;
  size_type idx;
  size_type parmsSize;
  ParameterTypes parms;
  Type *canonTy_3;
  Type *retTy;
  FunctionType *funcTy;
  TypeCanonicalizer *local_80;
  VoidType *canonTy_2;
  VoidType *voidTy;
  TypeCanonicalizer *local_60;
  BasicType *canonTy_1;
  BasicType *basicTy;
  Type *local_40;
  Type *canonTy;
  Type *elemTy;
  ArrayType *arrTy;
  Scope *scope_local;
  Type *ty_local;
  TypeCanonicalizer *this_local;
  
  arrTy = (ArrayType *)scope;
  scope_local = (Scope *)ty;
  ty_local = (Type *)this;
  TVar1 = Type::kind(ty);
  switch(TVar1) {
  case Array:
    iVar6 = (*scope_local->_vptr_Scope[3])();
    elemTy = (Type *)CONCAT44(extraout_var,iVar6);
    canonTy = ArrayType::elementType((ArrayType *)elemTy);
    local_40 = canonicalize(this,canonTy,(Scope *)arrTy);
    if (local_40 != canonTy) {
      ArrayType::resetElementType((ArrayType *)elemTy,local_40);
      std::
      unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
      ::insert(&this->discardedTys_,&canonTy);
    }
    break;
  case Basic:
    iVar6 = (*scope_local->_vptr_Scope[5])();
    canonTy_1 = (BasicType *)CONCAT44(extraout_var_00,iVar6);
    pCVar7 = SemanticModel::compilation(this->semaModel_);
    basicTyK = BasicType::kind(canonTy_1);
    local_60 = (TypeCanonicalizer *)Compilation::canonicalBasicType(pCVar7,basicTyK);
    if (local_60 != (TypeCanonicalizer *)canonTy_1) {
      std::
      unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
      ::insert(&this->discardedTys_,(value_type *)&scope_local);
      return (Type *)local_60;
    }
    break;
  case Function:
    iVar6 = (*scope_local->_vptr_Scope[7])();
    retTy = (Type *)CONCAT44(extraout_var_02,iVar6);
    canonTy_3 = FunctionType::returnType((FunctionType *)retTy);
    pTVar14 = canonicalize(this,canonTy_3,(Scope *)arrTy);
    if (pTVar14 != canonTy_3) {
      FunctionType::setReturnType((FunctionType *)retTy,pTVar14);
      pVar15 = std::
               unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
               ::insert(&this->discardedTys_,&canonTy_3);
      parms.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar15.first.super__Node_iterator_base<const_psy::C::Type_*,_false>._M_cur;
    }
    FunctionType::parameterTypes
              ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&parmsSize,
               (FunctionType *)retTy);
    idx = std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::size
                    ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
                     &parmsSize);
    for (parmTy = (Type *)0x0; parmTy < idx; parmTy = (Type *)((long)&parmTy->_vptr_Type + 1)) {
      ppTVar8 = std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::operator[]
                          ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
                           &parmsSize,(size_type)parmTy);
      local_e8 = *ppTVar8;
      pTVar14 = canonicalize(this,local_e8,(Scope *)arrTy);
      if (pTVar14 != local_e8) {
        FunctionType::setParameterType((FunctionType *)retTy,(size_type)parmTy,pTVar14);
        pVar15 = std::
                 unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
                 ::insert(&this->discardedTys_,&local_e8);
        ptrTy = (PointerType *)
                pVar15.first.super__Node_iterator_base<const_psy::C::Type_*,_false>._M_cur;
        local_100 = pVar15.second;
      }
    }
    std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::~vector
              ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&parmsSize);
    break;
  case Pointer:
    iVar6 = (*scope_local->_vptr_Scope[9])();
    refedTy = (Type *)CONCAT44(extraout_var_03,iVar6);
    canonTy_4 = PointerType::referencedType((PointerType *)refedTy);
    local_120 = canonicalize(this,canonTy_4,(Scope *)arrTy);
    if (local_120 != canonTy_4) {
      PointerType::resetReferencedType((PointerType *)refedTy,local_120);
      std::
      unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
      ::insert(&this->discardedTys_,&canonTy_4);
    }
    break;
  case TypedefName:
    iVar6 = (*scope_local->_vptr_Scope[0xb])();
    tydefName = (Identifier *)CONCAT44(extraout_var_04,iVar6);
    pTVar9 = TypedefNameType::declaration((TypedefNameType *)tydefName);
    if (pTVar9 != (TypedefDeclarationSymbol *)0x0) {
      pTVar9 = TypedefNameType::declaration((TypedefNameType *)tydefName);
      pTVar11 = (TypeCanonicalizer *)TypedefDeclarationSymbol::introducedSynonymType(pTVar9);
      return (Type *)pTVar11;
    }
    decl = (DeclarationSymbol *)TypedefNameType::typedefName((TypedefNameType *)tydefName);
    tyDecl = (TypeDeclarationSymbol *)
             Scope::searchForDeclaration((Scope *)arrTy,(Identifier *)decl,OrdinaryIdentifiers);
    if (tyDecl == (TypeDeclarationSymbol *)0x0) {
      C::SyntaxNode::lastToken((SyntaxToken *)&tagTy,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::TypeDeclarationNotFound(&this->diagReporter_,(SyntaxToken *)&tagTy);
      SyntaxToken::~SyntaxToken((SyntaxToken *)&tagTy);
    }
    else {
      DVar2 = DeclarationSymbol::category((DeclarationSymbol *)tyDecl);
      if (DVar2 == Type) {
        iVar6 = (*(tyDecl->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x17])();
        tydef = (TypedefDeclarationSymbol *)CONCAT44(extraout_var_05,iVar6);
        TVar3 = TypeDeclarationSymbol::category((TypeDeclarationSymbol *)tydef);
        if (TVar3 != Typedef) {
          poVar13 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar13 = std::operator<<(poVar13,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                   );
          poVar13 = std::operator<<(poVar13,":");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,0xf2);
          poVar13 = std::operator<<(poVar13," ");
          poVar13 = std::operator<<(poVar13,"<empty message>");
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          return (Type *)(TypeCanonicalizer *)scope_local;
        }
        iVar6 = (*(tydef->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
                  _vptr_Symbol[0x23])();
        local_158 = (TypedefDeclarationSymbol *)CONCAT44(extraout_var_06,iVar6);
        pIVar12 = (Identifier *)TypedefDeclarationSymbol::introducedSynonymType(local_158);
        if (pIVar12 != tydefName) {
          local_160 = (value_type)tydefName;
          pVar15 = std::
                   unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
                   ::insert(&this->discardedTys_,&local_160);
          local_170._M_cur =
               (__node_type *)
               pVar15.first.super__Node_iterator_base<const_psy::C::Type_*,_false>._M_cur;
          local_168 = pVar15.second;
          pTVar11 = (TypeCanonicalizer *)TypedefDeclarationSymbol::introducedSynonymType(local_158);
          return (Type *)pTVar11;
        }
        poVar13 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar13 = std::operator<<(poVar13,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                 );
        poVar13 = std::operator<<(poVar13,":");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,0xf4);
        poVar13 = std::operator<<(poVar13," ");
        poVar13 = std::operator<<(poVar13,"<empty message>");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        return (Type *)(TypeCanonicalizer *)scope_local;
      }
      C::SyntaxNode::lastToken(&local_1a8,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::ExpectedTypedefDeclaration(&this->diagReporter_,&local_1a8);
      SyntaxToken::~SyntaxToken(&local_1a8);
    }
    pCVar7 = SemanticModel::compilation(this->semaModel_);
    pTVar11 = (TypeCanonicalizer *)Compilation::canonicalErrorType(pCVar7);
    return (Type *)pTVar11;
  case Tag:
    iVar6 = (*scope_local->_vptr_Scope[0xd])();
    tag = (Identifier *)CONCAT44(extraout_var_07,iVar6);
    pTVar10 = TagType::declaration((TagType *)tag);
    if (pTVar10 != (TagDeclarationSymbol *)0x0) {
      pTVar10 = TagType::declaration((TagType *)tag);
      pTVar11 = (TypeCanonicalizer *)TagDeclarationSymbol::introducedNewType(pTVar10);
      return (Type *)pTVar11;
    }
    decl_1 = (DeclarationSymbol *)TagType::tag((TagType *)tag);
    tyDecl_1 = (TypeDeclarationSymbol *)
               Scope::searchForDeclaration((Scope *)arrTy,(Identifier *)decl_1,Tags);
    if (tyDecl_1 == (TypeDeclarationSymbol *)0x0) {
      C::SyntaxNode::lastToken((SyntaxToken *)&qualTy,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::TypeDeclarationNotFound(&this->diagReporter_,(SyntaxToken *)&qualTy);
      SyntaxToken::~SyntaxToken((SyntaxToken *)&qualTy);
    }
    else {
      DVar2 = DeclarationSymbol::category((DeclarationSymbol *)tyDecl_1);
      if (DVar2 != Type) {
        poVar13 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar13 = std::operator<<(poVar13,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                 );
        poVar13 = std::operator<<(poVar13,":");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,0x10d);
        poVar13 = std::operator<<(poVar13," ");
        poVar13 = std::operator<<(poVar13,"<empty message>");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        return (Type *)(TypeCanonicalizer *)scope_local;
      }
      iVar6 = (*(tyDecl_1->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x17])();
      tagDecl = (TagDeclarationSymbol *)CONCAT44(extraout_var_08,iVar6);
      TVar3 = TypeDeclarationSymbol::category((TypeDeclarationSymbol *)tagDecl);
      if (TVar3 != Tag) {
        poVar13 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar13 = std::operator<<(poVar13,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                 );
        poVar13 = std::operator<<(poVar13,":");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,0x10f);
        poVar13 = std::operator<<(poVar13," ");
        poVar13 = std::operator<<(poVar13,"<empty message>");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        return (Type *)(TypeCanonicalizer *)scope_local;
      }
      iVar6 = (*(tagDecl->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
                _vptr_Symbol[0x19])();
      local_208 = (TagDeclarationSymbol *)CONCAT44(extraout_var_09,iVar6);
      pIVar12 = (Identifier *)TagDeclarationSymbol::introducedNewType(local_208);
      if (pIVar12 == tag) {
        poVar13 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar13 = std::operator<<(poVar13,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                 );
        poVar13 = std::operator<<(poVar13,":");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,0x111);
        poVar13 = std::operator<<(poVar13," ");
        poVar13 = std::operator<<(poVar13,"<empty message>");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        return (Type *)(TypeCanonicalizer *)scope_local;
      }
      TVar4 = TagType::kind((TagType *)tag);
      this_00 = TagDeclarationSymbol::introducedNewType(local_208);
      TVar5 = TagType::kind(this_00);
      if (TVar4 == TVar5) {
        local_210 = (value_type)tag;
        pVar15 = std::
                 unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
                 ::insert(&this->discardedTys_,&local_210);
        local_220._M_cur =
             (__node_type *)
             pVar15.first.super__Node_iterator_base<const_psy::C::Type_*,_false>._M_cur;
        local_218 = pVar15.second;
        pTVar14 = &TagDeclarationSymbol::introducedNewType(local_208)->super_Type;
        pTVar11 = (TypeCanonicalizer *)canonicalize(this,pTVar14,(Scope *)arrTy);
        return (Type *)pTVar11;
      }
      C::SyntaxNode::lastToken(&local_258,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::TagTypeDoesNotMatchTagDeclaration(&this->diagReporter_,&local_258);
      SyntaxToken::~SyntaxToken(&local_258);
    }
    pCVar7 = SemanticModel::compilation(this->semaModel_);
    pTVar11 = (TypeCanonicalizer *)Compilation::canonicalErrorType(pCVar7);
    return (Type *)pTVar11;
  case Void:
    iVar6 = (*scope_local->_vptr_Scope[0xf])();
    canonTy_2 = (VoidType *)CONCAT44(extraout_var_01,iVar6);
    pCVar7 = SemanticModel::compilation(this->semaModel_);
    local_80 = (TypeCanonicalizer *)Compilation::canonicalVoidType(pCVar7);
    if (local_80 != (TypeCanonicalizer *)canonTy_2) {
      std::
      unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
      ::insert(&this->discardedTys_,(value_type *)&scope_local);
      return (Type *)local_80;
    }
    break;
  case Qualified:
    iVar6 = (*scope_local->_vptr_Scope[0x11])();
    unqualTy = (Type *)CONCAT44(extraout_var_10,iVar6);
    canonTy_5 = QualifiedType::unqualifiedType((QualifiedType *)unqualTy);
    local_340 = canonicalize(this,canonTy_5,(Scope *)arrTy);
    pTVar14 = unqualTy;
    if (local_340 != canonTy_5) {
      TVar1 = Type::kind(local_340);
      if (TVar1 == Qualified) {
        iVar6 = (*local_340->_vptr_Type[0x11])();
        local_340 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_11,iVar6))
        ;
      }
      QualifiedType::resetUnqualifiedType((QualifiedType *)pTVar14,local_340);
      std::
      unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
      ::insert(&this->discardedTys_,&canonTy_5);
    }
    break;
  case Error:
  }
  return (Type *)(TypeCanonicalizer *)scope_local;
}

Assistant:

const Type* TypeCanonicalizer::canonicalize(const Type* ty, const Scope* scope)
{
    switch (ty->kind()) {
        case TypeKind::Array: {
            auto arrTy = ty->asArrayType();
            auto elemTy = arrTy->elementType();
            auto canonTy = canonicalize(elemTy, scope);
            if (canonTy != elemTy) {
                arrTy->resetElementType(canonTy);
                discardedTys_.insert(elemTy);
            }
            break;
        }

        case TypeKind::Basic: {
            auto basicTy = ty->asBasicType();
            auto canonTy =
                semaModel_->compilation()->canonicalBasicType(basicTy->kind());
            if (canonTy != basicTy) {
                discardedTys_.insert(ty);
                return canonTy;
            }
            break;
        }

        case TypeKind::Void: {
            auto voidTy = ty->asVoidType();
            auto canonTy = semaModel_->compilation()->canonicalVoidType();
            if (canonTy != voidTy) {
                discardedTys_.insert(ty);
                return canonTy;
            }
            break;
        }

        case TypeKind::Function: {
            auto funcTy = ty->asFunctionType();
            auto retTy = funcTy->returnType();
            auto canonTy = canonicalize(retTy, scope);
            if (canonTy != retTy) {
                funcTy->setReturnType(canonTy);
                discardedTys_.insert(retTy);
            }
            const auto parms = funcTy->parameterTypes();
            const auto parmsSize = parms.size();
            for (FunctionType::ParameterTypes::size_type idx = 0; idx < parmsSize; ++idx) {
                const Type* parmTy = parms[idx];
                canonTy = canonicalize(parmTy, scope);
                if (canonTy != parmTy) {
                    funcTy->setParameterType(idx, canonTy);
                    discardedTys_.insert(parmTy);
                }
            }
            break;
        }

        case TypeKind::Pointer: {
            auto ptrTy = ty->asPointerType();
            auto refedTy = ptrTy->referencedType();
            auto canonTy = canonicalize(refedTy, scope);
            if (canonTy != refedTy) {
                ptrTy->resetReferencedType(canonTy);
                discardedTys_.insert(refedTy);
            }
            break;
        }

        case TypeKind::TypedefName: {
            auto tydefNameTy = ty->asTypedefNameType();
            if (tydefNameTy->declaration())
                return tydefNameTy->declaration()->introducedSynonymType();
            auto tydefName = tydefNameTy->typedefName();
            auto decl = scope->searchForDeclaration(
                        tydefName,
                        NameSpace::OrdinaryIdentifiers);
            if (decl) {
                if (decl->category() == DeclarationCategory::Type) {
                    auto tyDecl = decl->asTypeDeclaration();
                    // A type declaration found under the ordinary identifiers
                    // namespace must be that of a typedef.
                    PSY_ASSERT_2(tyDecl->category() == TypeDeclarationCategory::Typedef, return ty);
                    auto tydef = tyDecl->asTypedefDeclaration();
                    PSY_ASSERT_2(tydef->introducedSynonymType() != tydefNameTy, return ty);
                    discardedTys_.insert(tydefNameTy);
                    return tydef->introducedSynonymType();
                }
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.ExpectedTypedefDeclaration(tySpecNode_->lastToken());
            }
            else {
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TypeDeclarationNotFound(tySpecNode_->lastToken());
            }
            return semaModel_->compilation()->canonicalErrorType();
        }

        case TypeKind::Tag: {
            auto tagTy = ty->asTagType();
            if (tagTy->declaration())
                return tagTy->declaration()->introducedNewType();
            auto tag = tagTy->tag();
            auto decl = scope->searchForDeclaration(
                        tag,
                        NameSpace::Tags);
            if (decl) {
                // A declaration found under the tags name space must be that
                // of a tag type declaration.
                PSY_ASSERT_2(decl->category() == DeclarationCategory::Type, return ty);
                auto tyDecl = decl->asTypeDeclaration();
                PSY_ASSERT_2(tyDecl->category() == TypeDeclarationCategory::Tag, return ty);
                auto tagDecl = tyDecl->asTagTypeDeclaration();
                PSY_ASSERT_2(tagDecl->introducedNewType() != tagTy, return ty);
                if (tagTy->kind() == tagDecl->introducedNewType()->kind()) {
                    discardedTys_.insert(tagTy);
                    return canonicalize(tagDecl->introducedNewType(), scope);
                }
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TagTypeDoesNotMatchTagDeclaration(tySpecNode_->lastToken());
            } else {
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TypeDeclarationNotFound(tySpecNode_->lastToken());
            }
            return semaModel_->compilation()->canonicalErrorType();
        }

        case TypeKind::Qualified: {
            auto qualTy = ty->asQualifiedType();
            auto unqualTy = qualTy->unqualifiedType();
            auto canonTy = canonicalize(unqualTy, scope);
            if (canonTy != unqualTy) {
                qualTy->resetUnqualifiedType(
                        canonTy->kind() == TypeKind::Qualified
                            ? canonTy->asQualifiedType()->unqualifiedType()
                            : canonTy);
                discardedTys_.insert(unqualTy);
            }
            break;
        }

        case TypeKind::Error:
            break;
    }

    return ty;
}